

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GridAxisIrregular.cpp
# Opt level: O0

KString * __thiscall
KDIS::DATA_TYPE::GridAxisIrregular::GetAsString_abi_cxx11_
          (KString *__return_storage_ptr__,GridAxisIrregular *this)

{
  bool bVar1;
  ostream *poVar2;
  reference puVar3;
  __normal_iterator<const_unsigned_short_*,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>
  local_1c0;
  const_iterator citrEnd;
  const_iterator citr;
  stringstream local_1a0 [8];
  KStringStream ss;
  ostream local_190 [376];
  GridAxisIrregular *local_18;
  GridAxisIrregular *this_local;
  
  local_18 = this;
  this_local = (GridAxisIrregular *)__return_storage_ptr__;
  std::__cxx11::stringstream::stringstream(local_1a0);
  poVar2 = std::operator<<(local_190,"Grid Axis Irregular:");
  poVar2 = std::operator<<(poVar2,"\n\tDomain Initial Xi:    ");
  poVar2 = (ostream *)
           std::ostream::operator<<
                     (poVar2,(double)(this->super_GridAxisRegular).m_f64DomainInitialXi);
  poVar2 = std::operator<<(poVar2,"\n\tDomain Final Xi:      ");
  poVar2 = (ostream *)
           std::ostream::operator<<(poVar2,(double)(this->super_GridAxisRegular).m_f64DomainFinalXi)
  ;
  poVar2 = std::operator<<(poVar2,"\n\tDomain Points Xi:     ");
  poVar2 = (ostream *)
           std::ostream::operator<<(poVar2,(this->super_GridAxisRegular).m_ui16DomainPointsXi);
  poVar2 = std::operator<<(poVar2,"\n\tInterleaf Factor:     ");
  poVar2 = (ostream *)
           std::ostream::operator<<
                     (poVar2,(ushort)(this->super_GridAxisRegular).m_ui8InterleafFactor);
  poVar2 = std::operator<<(poVar2,"\n\tAxis Type:            ");
  poVar2 = (ostream *)
           std::ostream::operator<<(poVar2,(ushort)(this->super_GridAxisRegular).m_ui8AxisType);
  poVar2 = std::operator<<(poVar2,"\n\tNumber Of Points:     ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,(this->super_GridAxisRegular).m_ui16NumPoints)
  ;
  poVar2 = std::operator<<(poVar2,"\n\tInitial Index:        ");
  poVar2 = (ostream *)
           std::ostream::operator<<(poVar2,(this->super_GridAxisRegular).m_ui16InitialIndex);
  poVar2 = std::operator<<(poVar2,"\n\tCoordinate Scale Xi:  ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,(double)this->m_f64CoordScaleXi);
  poVar2 = std::operator<<(poVar2,"\n\tCoordinate Offset Xi: ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,(double)this->m_f64CoordOffsetXi);
  std::operator<<(poVar2,"\n\tXi Values:");
  citrEnd = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::begin(&this->m_vXiValues);
  local_1c0._M_current =
       (unsigned_short *)
       std::vector<unsigned_short,_std::allocator<unsigned_short>_>::end(&this->m_vXiValues);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=(&citrEnd,&local_1c0);
    if (!bVar1) break;
    poVar2 = std::operator<<(local_190,"\n\t");
    puVar3 = __gnu_cxx::
             __normal_iterator<const_unsigned_short_*,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>
             ::operator*(&citrEnd);
    std::ostream::operator<<(poVar2,*puVar3);
    __gnu_cxx::
    __normal_iterator<const_unsigned_short_*,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>
    ::operator++(&citrEnd);
  }
  std::operator<<(local_190,"\n");
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

KString GridAxisIrregular::GetAsString() const
{
    KStringStream ss;

    ss << "Grid Axis Irregular:"
       << "\n\tDomain Initial Xi:    " << m_f64DomainInitialXi
       << "\n\tDomain Final Xi:      " << m_f64DomainFinalXi
       << "\n\tDomain Points Xi:     " << m_ui16DomainPointsXi
       << "\n\tInterleaf Factor:     " << ( KUINT16 )m_ui8InterleafFactor
       << "\n\tAxis Type:            " << ( KUINT16 )m_ui8AxisType
       << "\n\tNumber Of Points:     " << m_ui16NumPoints
       << "\n\tInitial Index:        " << m_ui16InitialIndex
       << "\n\tCoordinate Scale Xi:  " << m_f64CoordScaleXi
       << "\n\tCoordinate Offset Xi: " << m_f64CoordOffsetXi
       << "\n\tXi Values:";

    vector<KUINT16>::const_iterator citr = m_vXiValues.begin();
    vector<KUINT16>::const_iterator citrEnd = m_vXiValues.end();

    for( ; citr != citrEnd; ++citr )
    {
        ss << "\n\t" << *citr;
    }

    ss << "\n";

    return ss.str();
}